

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O1

bool embree::operator==(Token *a,Token *b)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if (a->ty == b->ty) {
    bVar2 = true;
    switch(a->ty) {
    case TY_CHAR:
      bVar2 = (a->field_1).c == (b->field_1).c;
      break;
    case TY_INT:
      bVar2 = (a->field_1).i == (b->field_1).i;
      break;
    case TY_FLOAT:
      bVar2 = (bool)(-((b->field_1).f == (a->field_1).f) & 1);
      break;
    case TY_IDENTIFIER:
    case TY_STRING:
    case TY_SYMBOL:
      __n = (a->str)._M_string_length;
      if (__n == (b->str)._M_string_length) {
        if (__n == 0) {
          return true;
        }
        iVar1 = bcmp((a->str)._M_dataplus._M_p,(b->str)._M_dataplus._M_p,__n);
        return iVar1 == 0;
      }
      goto LAB_009e780e;
    }
  }
  else {
LAB_009e780e:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const Token& a, const Token& b)
    {
      if (a.ty != b.ty) return false;
      if (a.ty == TY_CHAR) return a.c == b.c;
      if (a.ty == TY_INT) return a.i == b.i;
      if (a.ty == TY_FLOAT) return a.f == b.f;
      if (a.ty == TY_IDENTIFIER) return a.str == b.str;
      if (a.ty == TY_STRING) return a.str == b.str;
      if (a.ty == TY_SYMBOL) return a.str == b.str;
      return true;
    }